

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expmod.c
# Opt level: O0

int main(void)

{
  uint64_t uVar1;
  uint64_t unaff_retaddr;
  uint64_t in_stack_00000008;
  uint64_t in_stack_00000010;
  int local_4;
  
  uVar1 = expmod(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (((uVar1 == 0x2d9) &&
      (uVar1 = expmod(in_stack_00000010,in_stack_00000008,unaff_retaddr), uVar1 == 0x1e3ca43954aa8))
     && (uVar1 = expmod(in_stack_00000010,in_stack_00000008,unaff_retaddr),
        uVar1 == 0x3a67a22ee50e7883)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main() {

    // test with small numbers

    if(expmod(432, 18, 765) != 729)
        goto error;

    if(expmod(98765432456, 21345654321, 1234567654325432) != 531932833467048)
        goto error;

    // test with big numbers

    if(expmod(1234567654326545432, 0x84b603a249dbac18, 4611686094970622477) != 4208510699096144003)
        goto error;

    return 0;


    error:
        return 1;

}